

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_rowcol_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  uint uVar9;
  parasail_result_t *ppVar10;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar40 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint uVar45;
  uint uVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM12 [16];
  int iVar55;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  uint local_148;
  uint local_138;
  int32_t *local_130;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  uint uVar53;
  uint uVar54;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_rowcol_diag_sse41_128_32_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_rowcol_diag_sse41_128_32_cold_6();
  }
  else if (open < 0) {
    parasail_nw_rowcol_diag_sse41_128_32_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_rowcol_diag_sse41_128_32_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_rowcol_diag_sse41_128_32_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_rowcol_diag_sse41_128_32_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar15 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_rowcol_diag_sse41_128_32_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar15 = (ulong)(uint)matrix->length;
    }
    iVar17 = -open;
    iVar7 = matrix->min;
    uVar36 = 0x80000000 - iVar7;
    if (iVar7 != iVar17 && SBORROW4(iVar7,iVar17) == iVar7 + open < 0) {
      uVar36 = open | 0x80000000;
    }
    uVar26 = 0x7ffffffe - matrix->max;
    uVar14 = (uint)uVar15;
    ppVar10 = parasail_result_new_rowcol1(uVar14,s2Len);
    if (ppVar10 != (parasail_result_t *)0x0) {
      ppVar10->flag = ppVar10->flag | 0x4441001;
      uVar24 = (ulong)(s2Len + 6);
      ptr = parasail_memalign_int32_t(0x10,uVar24);
      ptr_00 = parasail_memalign_int32_t(0x10,uVar24);
      ptr_01 = parasail_memalign_int32_t(0x10,uVar24);
      if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
        if (matrix->type == 0) {
          iVar7 = uVar14 + 3;
          local_130 = parasail_memalign_int32_t(0x10,(long)iVar7);
          if (local_130 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar14) {
            piVar2 = matrix->mapper;
            uVar24 = 0;
            do {
              local_130[uVar24] = piVar2[(byte)_s1[uVar24]];
              uVar24 = uVar24 + 1;
            } while (uVar15 != uVar24);
          }
          iVar8 = uVar14 + 1;
          if ((int)(uVar14 + 1) < iVar7) {
            iVar8 = iVar7;
          }
          memset(local_130 + (int)uVar14,0,(ulong)(~uVar14 + iVar8) * 4 + 4);
        }
        else {
          local_130 = (int32_t *)0x0;
        }
        uVar9 = s2Len + 3;
        local_148 = uVar14 - 1;
        local_138 = s2Len - 1;
        iVar7 = uVar36 + 1;
        iStack_e0 = iVar17 - gap;
        iStack_e4 = iVar17 + gap * -2;
        local_e8 = -(gap * 3 + open);
        piVar2 = matrix->mapper;
        uVar24 = 1;
        if (1 < s2Len) {
          uVar24 = (ulong)(uint)s2Len;
        }
        uVar12 = 0;
        do {
          ptr[uVar12 + 3] = piVar2[(byte)_s2[uVar12]];
          uVar12 = uVar12 + 1;
        } while (uVar24 != uVar12);
        ptr[2] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        uVar12 = (ulong)(uint)s2Len;
        uVar36 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar9) {
          uVar36 = uVar9;
        }
        uVar25 = 0;
        memset(ptr + uVar12 + 3,0,(ulong)(~s2Len + uVar36) * 4 + 4);
        iVar8 = iVar17;
        do {
          ptr_00[uVar25 + 3] = iVar8;
          ptr_01[uVar25 + 3] = iVar7;
          uVar25 = uVar25 + 1;
          iVar8 = iVar8 - gap;
        } while (uVar24 != uVar25);
        lVar11 = 0;
        do {
          ptr_00[lVar11] = iVar7;
          ptr_01[lVar11] = iVar7;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar11 = uVar12 + 3;
        do {
          ptr_00[lVar11] = iVar7;
          ptr_01[lVar11] = iVar7;
          lVar11 = lVar11 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar9);
        ptr_00[2] = 0;
        uVar36 = uVar26;
        uVar37 = uVar26;
        uVar38 = uVar26;
        uVar39 = uVar26;
        if ((int)uVar14 < 1) {
          auVar34._4_4_ = iVar7;
          auVar34._0_4_ = iVar7;
          auVar34._8_4_ = iVar7;
          auVar34._12_4_ = iVar7;
          auVar40 = auVar34;
        }
        else {
          piVar2 = matrix->matrix;
          auVar5._4_4_ = iVar7;
          auVar5._0_4_ = iVar7;
          auVar5._8_4_ = iVar7;
          auVar34._12_4_ = iVar7;
          auVar34._0_12_ = auVar5;
          uVar24 = 1;
          if (1 < (int)uVar9) {
            uVar24 = (ulong)uVar9;
          }
          uVar18 = (ulong)local_148;
          auVar41 = pmovsxbd(in_XMM5,0x10203);
          uVar25 = 0;
          auVar40 = auVar34;
          iStack_dc = iVar17;
          do {
            iVar8 = matrix->type;
            uVar9 = (uint)uVar25;
            uVar14 = uVar9;
            if (iVar8 == 0) {
              uVar14 = local_130[uVar25];
            }
            uVar23 = uVar25 | 1;
            if (iVar8 == 0) {
              uVar13 = local_130[uVar23];
            }
            else {
              uVar13 = local_148;
              if (uVar23 < uVar15) {
                uVar13 = uVar9 | 1;
              }
            }
            uVar16 = uVar25 | 2;
            if (iVar8 == 0) {
              uVar20 = local_130[uVar16];
            }
            else {
              uVar20 = local_148;
              if (uVar16 < uVar15) {
                uVar20 = uVar9 | 2;
              }
            }
            uVar22 = uVar25 | 3;
            if (iVar8 == 0) {
              uVar19 = local_130[uVar22];
            }
            else {
              uVar19 = local_148;
              if (uVar22 < uVar15) {
                uVar19 = uVar9 | 3;
              }
            }
            iVar8 = matrix->size;
            uVar1 = uVar25 + 4;
            auVar42._0_8_ = auVar5._4_8_;
            auVar42._12_4_ = ptr_00[2];
            auVar42._8_4_ = iVar7;
            ptr_00[2] = iVar17 - (int)uVar1 * gap;
            auVar47._12_4_ = iVar17 - uVar9 * gap;
            auVar47._8_4_ = iVar7;
            auVar47._0_8_ = auVar42._0_8_;
            auVar52._0_4_ = -(uint)(auVar41._0_4_ == local_148);
            uVar9 = auVar41._4_4_;
            auVar52._4_4_ = -(uint)(uVar9 == local_148);
            uVar53 = auVar41._8_4_;
            uVar54 = auVar41._12_4_;
            auVar52._8_4_ = -(uint)(uVar53 == local_148);
            auVar52._12_4_ = -(uint)(uVar54 == local_148);
            uVar21 = 0;
            in_XMM12 = pmovsxbd(in_XMM12,0xfffefd);
            auVar57._4_4_ = iVar7;
            auVar57._0_4_ = iVar7;
            auVar57._8_4_ = iVar7;
            auVar57._12_4_ = iVar7;
            auVar29 = auVar34;
            auVar62 = auVar57;
            do {
              iVar50 = auVar47._12_4_;
              auVar44._0_8_ = auVar47._4_8_;
              auVar43._0_12_ = auVar47._4_12_;
              auVar43._12_4_ = iVar50;
              auVar44._8_8_ = auVar43._8_8_ & 0xffffffff | (ulong)(uint)ptr_00[uVar21 + 3] << 0x20;
              iVar63 = piVar2[(long)(int)(uVar19 * iVar8) + (long)ptr[uVar21]] + auVar42._0_4_;
              iVar64 = piVar2[(long)(int)(uVar20 * iVar8) + (long)ptr[uVar21 + 1]] + auVar42._4_4_;
              iVar65 = piVar2[(long)(int)(uVar13 * iVar8) + (long)ptr[uVar21 + 2]] + auVar42._8_4_;
              iVar66 = piVar2[(long)(int)(uVar14 * iVar8) + (long)ptr[uVar21 + 3]] + auVar42._12_4_;
              iVar27 = auVar47._4_4_ - open;
              iVar31 = auVar47._8_4_ - open;
              iVar32 = iVar50 - open;
              iVar33 = ptr_00[uVar21 + 3] - open;
              iVar55 = auVar57._4_4_ - gap;
              iVar58 = auVar57._8_4_ - gap;
              iVar59 = auVar57._12_4_ - gap;
              iVar60 = ptr_01[uVar21 + 3] - gap;
              auVar56._0_4_ = (uint)(iVar55 < iVar27) * iVar27 | (uint)(iVar55 >= iVar27) * iVar55;
              auVar56._4_4_ = (uint)(iVar58 < iVar31) * iVar31 | (uint)(iVar58 >= iVar31) * iVar58;
              auVar56._8_4_ = (uint)(iVar59 < iVar32) * iVar32 | (uint)(iVar59 >= iVar32) * iVar59;
              auVar56._12_4_ = (uint)(iVar60 < iVar33) * iVar33 | (uint)(iVar60 >= iVar33) * iVar60;
              iVar27 = auVar47._0_4_ - open;
              iVar31 = auVar47._4_4_ - open;
              iVar32 = auVar47._8_4_ - open;
              iVar50 = iVar50 - open;
              iVar33 = auVar62._0_4_ - gap;
              iVar55 = auVar62._4_4_ - gap;
              iVar58 = auVar62._8_4_ - gap;
              iVar59 = auVar62._12_4_ - gap;
              auVar61._0_4_ = (uint)(iVar33 < iVar27) * iVar27 | (uint)(iVar33 >= iVar27) * iVar33;
              auVar61._4_4_ = (uint)(iVar55 < iVar31) * iVar31 | (uint)(iVar55 >= iVar31) * iVar55;
              auVar61._8_4_ = (uint)(iVar58 < iVar32) * iVar32 | (uint)(iVar58 >= iVar32) * iVar58;
              auVar61._12_4_ = (uint)(iVar59 < iVar50) * iVar50 | (uint)(iVar59 >= iVar50) * iVar59;
              uVar45 = ((int)auVar61._0_4_ < (int)auVar56._0_4_) * auVar56._0_4_ |
                       ((int)auVar61._0_4_ >= (int)auVar56._0_4_) * auVar61._0_4_;
              uVar48 = ((int)auVar61._4_4_ < (int)auVar56._4_4_) * auVar56._4_4_ |
                       ((int)auVar61._4_4_ >= (int)auVar56._4_4_) * auVar61._4_4_;
              uVar49 = ((int)auVar61._8_4_ < (int)auVar56._8_4_) * auVar56._8_4_ |
                       ((int)auVar61._8_4_ >= (int)auVar56._8_4_) * auVar61._8_4_;
              uVar51 = ((int)auVar61._12_4_ < (int)auVar56._12_4_) * auVar56._12_4_ |
                       ((int)auVar61._12_4_ >= (int)auVar56._12_4_) * auVar61._12_4_;
              auVar46._0_4_ =
                   (uint)((int)uVar45 < iVar63) * iVar63 | ((int)uVar45 >= iVar63) * uVar45;
              auVar46._4_4_ =
                   (uint)((int)uVar48 < iVar64) * iVar64 | ((int)uVar48 >= iVar64) * uVar48;
              auVar46._8_4_ =
                   (uint)((int)uVar49 < iVar65) * iVar65 | ((int)uVar49 >= iVar65) * uVar49;
              auVar46._12_4_ =
                   (uint)((int)uVar51 < iVar66) * iVar66 | ((int)uVar51 >= iVar66) * uVar51;
              uVar45 = in_XMM12._0_4_;
              auVar28._0_4_ = -(uint)(uVar45 == 0xffffffff);
              uVar48 = in_XMM12._4_4_;
              auVar28._4_4_ = -(uint)(uVar48 == 0xffffffff);
              uVar49 = in_XMM12._8_4_;
              uVar51 = in_XMM12._12_4_;
              auVar28._8_4_ = -(uint)(uVar49 == 0xffffffff);
              auVar28._12_4_ = -(uint)(uVar51 == 0xffffffff);
              auVar6._4_4_ = iStack_e4;
              auVar6._0_4_ = local_e8;
              auVar6._8_4_ = iStack_e0;
              auVar6._12_4_ = iStack_dc;
              auVar47 = blendvps(auVar46,auVar6,auVar28);
              auVar62._4_4_ = iVar7;
              auVar62._0_4_ = iVar7;
              auVar62._8_4_ = iVar7;
              auVar62._12_4_ = iVar7;
              auVar57 = blendvps(auVar56,auVar62,auVar28);
              auVar62 = blendvps(auVar61,auVar62,auVar28);
              iVar27 = auVar47._0_4_;
              iVar31 = auVar47._4_4_;
              iVar32 = auVar47._8_4_;
              iVar33 = auVar47._12_4_;
              auVar34 = auVar29;
              if (3 < uVar21) {
                uVar36 = (uint)(iVar27 < (int)uVar36) * iVar27 | (iVar27 >= (int)uVar36) * uVar36;
                uVar37 = (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
                uVar38 = (uint)(iVar32 < (int)uVar38) * iVar32 | (iVar32 >= (int)uVar38) * uVar38;
                uVar39 = (uint)(iVar33 < (int)uVar39) * iVar33 | (iVar33 >= (int)uVar39) * uVar39;
                iVar50 = auVar29._0_4_;
                auVar34._0_4_ = (uint)(iVar50 < iVar27) * iVar27 | (uint)(iVar50 >= iVar27) * iVar50
                ;
                iVar50 = auVar29._4_4_;
                auVar34._4_4_ = (uint)(iVar50 < iVar31) * iVar31 | (uint)(iVar50 >= iVar31) * iVar50
                ;
                iVar50 = auVar29._8_4_;
                iVar55 = auVar29._12_4_;
                auVar34._8_4_ = (uint)(iVar50 < iVar32) * iVar32 | (uint)(iVar50 >= iVar32) * iVar50
                ;
                auVar34._12_4_ =
                     (uint)(iVar55 < iVar33) * iVar33 | (uint)(iVar55 >= iVar33) * iVar55;
              }
              piVar3 = ((ppVar10->field_4).rowcols)->score_row;
              piVar4 = ((ppVar10->field_4).rowcols)->score_col;
              if (uVar25 == uVar18 && uVar21 < uVar12) {
                piVar3[uVar21] = iVar33;
              }
              if (local_138 == uVar21) {
                piVar4[uVar25] = iVar33;
              }
              if (uVar21 - 1 < uVar12 && uVar23 == uVar18) {
                piVar3[uVar21 - 1] = iVar32;
              }
              if (uVar12 == uVar21 && uVar23 < uVar15) {
                piVar4[uVar23] = iVar32;
              }
              if ((uVar16 == uVar18) && ((long)(uVar21 - 2) < (long)uVar12 && 1 < uVar21)) {
                piVar3[uVar21 - 2] = iVar31;
              }
              if (uVar12 + 1 == uVar21 && uVar16 < uVar15) {
                piVar4[uVar16] = iVar31;
              }
              if ((uVar22 == uVar18) && ((long)(uVar21 - 3) < (long)uVar12 && 2 < uVar21)) {
                piVar3[uVar21 - 3] = iVar27;
              }
              if (uVar12 + 2 == uVar21 && uVar22 < uVar15) {
                piVar4[uVar22] = iVar27;
              }
              ptr_00[uVar21] = iVar27;
              auVar29._0_4_ = -(uint)(uVar45 == local_138);
              auVar29._4_4_ = -(uint)(uVar48 == local_138);
              auVar29._8_4_ = -(uint)(uVar49 == local_138);
              auVar29._12_4_ = -(uint)(uVar51 == local_138);
              auVar40 = blendvps(auVar40,auVar47,auVar29 & auVar52);
              ptr_01[uVar21] = auVar57._0_4_;
              in_XMM12._0_4_ = uVar45 + 1;
              in_XMM12._4_4_ = uVar48 + 1;
              in_XMM12._8_4_ = uVar49 + 1;
              in_XMM12._12_4_ = uVar51 + 1;
              uVar21 = uVar21 + 1;
              auVar29 = auVar34;
              auVar42 = auVar44;
            } while (uVar24 != uVar21);
            auVar41._0_4_ = auVar41._0_4_ + 4;
            auVar41._4_4_ = uVar9 + 4;
            auVar41._8_4_ = uVar53 + 4;
            auVar41._12_4_ = uVar54 + 4;
            local_e8 = local_e8 + gap * -4;
            iStack_e4 = iStack_e4 + gap * -4;
            iStack_e0 = iStack_e0 + gap * -4;
            iStack_dc = iStack_dc + gap * -4;
            uVar25 = uVar1;
          } while (uVar1 < uVar15);
        }
        iVar8 = 4;
        iVar17 = iVar7;
        do {
          uVar15 = auVar40._0_8_;
          lVar11 = auVar40._8_8_;
          if (iVar17 < auVar40._12_4_) {
            iVar17 = auVar40._12_4_;
          }
          auVar40._0_8_ = uVar15 << 0x20;
          auVar40._8_8_ = lVar11 << 0x20 | uVar15 >> 0x20;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        auVar30._0_4_ = -(uint)((int)uVar36 < iVar7);
        auVar30._4_4_ = -(uint)((int)uVar37 < iVar7);
        auVar30._8_4_ = -(uint)((int)uVar38 < iVar7);
        auVar30._12_4_ = -(uint)((int)uVar39 < iVar7);
        auVar35._0_4_ = -(uint)((int)uVar26 < auVar34._0_4_);
        auVar35._4_4_ = -(uint)((int)uVar26 < auVar34._4_4_);
        auVar35._8_4_ = -(uint)((int)uVar26 < auVar34._8_4_);
        auVar35._12_4_ = -(uint)((int)uVar26 < auVar34._12_4_);
        iVar7 = movmskps(0,auVar35 | auVar30);
        if (iVar7 != 0) {
          *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
          iVar17 = 0;
          local_138 = 0;
          local_148 = 0;
        }
        ppVar10->score = iVar17;
        ppVar10->end_query = local_148;
        ppVar10->end_ref = local_138;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_130);
          return ppVar10;
        }
        return ppVar10;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMax = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32(vMax, 3);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}